

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

bool __thiscall
QFileDialogPrivate::restoreWidgetState
          (QFileDialogPrivate *this,QStringList *history,int splitterPosition)

{
  long lVar1;
  long lVar2;
  QAction *pQVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QWidget *pQVar7;
  pointer piVar8;
  iterator abegin;
  iterator iVar9;
  uint uVar10;
  ulong uVar11;
  QAbstractProxyModel *pQVar12;
  int i;
  undefined1 *puVar13;
  long in_FS_OFFSET;
  int local_70 [6];
  QList<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  if (splitterPosition < 0) {
    bVar4 = QSplitter::restoreState(((this->qFileDialogUi).d)->splitter,&this->splitterState);
    if (bVar4) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
      QSplitter::sizes((QList<int> *)&local_58,((this->qFileDialogUi).d)->splitter);
      if (((undefined1 *)0x1 < (ulong)local_58.d.size) &&
         ((*(int *)local_58.d.ptr == 0 || (*(int *)((long)local_58.d.ptr + 4) == 0)))) {
        puVar13 = (undefined1 *)0x0;
        do {
          pQVar7 = QSplitter::widget(((this->qFileDialogUi).d)->splitter,(int)puVar13);
          iVar5 = (**(code **)(*(long *)pQVar7 + 0x70))(pQVar7);
          piVar8 = QList<int>::data((QList<int> *)&local_58);
          piVar8[(long)puVar13] = iVar5;
          puVar13 = puVar13 + 1;
        } while (puVar13 < (ulong)local_58.d.size);
        QSplitter::setSizes(((this->qFileDialogUi).d)->splitter,(QList<int> *)&local_58);
      }
      goto LAB_004dde2c;
    }
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QAction **)0x0;
    local_58.d.size = 0;
    local_70[0] = splitterPosition;
    QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)&local_58,0,local_70);
    QList<int>::end((QList<int> *)&local_58);
    pQVar7 = QSplitter::widget(((this->qFileDialogUi).d)->splitter,1);
    local_70[0] = (**(code **)(*(long *)pQVar7 + 0x70))(pQVar7);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_58,local_58.d.size,local_70);
    QList<int>::end((QList<int> *)&local_58);
    QSplitter::setSizes(((this->qFileDialogUi).d)->splitter,(QList<int> *)&local_58);
LAB_004dde2c:
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
      }
    }
    QUrlModel::setUrls(((this->qFileDialogUi).d)->sidebar->urlModel,&this->sidebarUrls);
    if (5 < (ulong)(history->d).size) {
      abegin = QList<QString>::begin(history);
      iVar9 = QList<QString>::end(history);
      QList<QString>::erase(history,(const_iterator)abegin.i,iVar9.i + -5);
    }
    lVar1 = *(long *)(lVar1 + 8);
    lVar2 = *(long *)(lVar1 + 0x370);
    if (lVar2 != 0 && *(char *)(lVar1 + 0x2c8) == '\0') {
      QFileDialogComboBox::setHistory(*(QFileDialogComboBox **)(lVar2 + 0x18),history);
    }
    pQVar7 = (QWidget *)QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
    bVar4 = QHeaderView::restoreState((QHeaderView *)pQVar7,&this->headerData);
    if (bVar4) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::actions(&local_58,pQVar7);
      pQVar12 = this->proxyModel;
      if (pQVar12 == (QAbstractProxyModel *)0x0) {
        pQVar12 = (QAbstractProxyModel *)this->model;
      }
      local_70[0] = -1;
      local_70[1] = -1;
      local_70[2] = 0;
      local_70[3] = 0;
      local_70[4] = 0;
      local_70[5] = 0;
      uVar6 = (**(code **)(*(long *)pQVar12 + 0x80))();
      uVar10 = (int)local_58.d.size + 1U;
      if ((int)uVar6 < (int)((int)local_58.d.size + 1U)) {
        uVar10 = uVar6;
      }
      if (1 < (int)uVar10) {
        uVar11 = 1;
        do {
          pQVar3 = local_58.d.ptr[uVar11 - 1];
          QHeaderView::isSectionHidden((QHeaderView *)pQVar7,(int)uVar11);
          QAction::setChecked(SUB81(pQVar3,0));
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
      bVar4 = true;
      goto LAB_004ddf9e;
    }
  }
  bVar4 = false;
LAB_004ddf9e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QFileDialogPrivate::restoreWidgetState(QStringList &history, int splitterPosition)
{
    Q_Q(QFileDialog);
    if (splitterPosition >= 0) {
        QList<int> splitterSizes;
        splitterSizes.append(splitterPosition);
        splitterSizes.append(qFileDialogUi->splitter->widget(1)->sizeHint().width());
        qFileDialogUi->splitter->setSizes(splitterSizes);
    } else {
        if (!qFileDialogUi->splitter->restoreState(splitterState))
            return false;
        QList<int> list = qFileDialogUi->splitter->sizes();
        if (list.size() >= 2 && (list.at(0) == 0 || list.at(1) == 0)) {
            for (int i = 0; i < list.size(); ++i)
                list[i] = qFileDialogUi->splitter->widget(i)->sizeHint().width();
            qFileDialogUi->splitter->setSizes(list);
        }
    }

    qFileDialogUi->sidebar->setUrls(sidebarUrls);

    static const int MaxHistorySize = 5;
    if (history.size() > MaxHistorySize)
        history.erase(history.begin(), history.end() - MaxHistorySize);
    q->setHistory(history);

    QHeaderView *headerView = qFileDialogUi->treeView->header();
    if (!headerView->restoreState(headerData))
        return false;

    QList<QAction*> actions = headerView->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i)
        actions.at(i - 1)->setChecked(!headerView->isSectionHidden(i));

    return true;
}